

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O2

bool test::ValidatePreconnectData(uint channel,uint8_t *data,uint bytes)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  bool bVar4;
  
  if (channel != 0x37 || bytes != 10) {
    return false;
  }
  lVar3 = 0;
  do {
    bVar4 = lVar3 == 10;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = data + lVar3;
    puVar2 = &PreConnectData + lVar3;
    lVar3 = lVar3 + 1;
  } while (*puVar1 == *puVar2);
  return bVar4;
}

Assistant:

bool ValidatePreconnectData(unsigned channel, const uint8_t* data, unsigned bytes)
{
    if (bytes != kPreConnectDataBytes || channel != kPreConnectChannel)
        return false;

    for (unsigned i = 0; i < kPreConnectDataBytes; ++i)
        if (data[i] != PreConnectData[i])
            return false;

    return true;
}